

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall
PKCS12Test_RoundTrip_Test::~PKCS12Test_RoundTrip_Test(PKCS12Test_RoundTrip_Test *this)

{
  PKCS12Test_RoundTrip_Test *this_local;
  
  ~PKCS12Test_RoundTrip_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PKCS12Test, RoundTrip) {
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, 0, 0, 0, 0);

  // Test some Unicode.
  TestRoundTrip(kPassword, "Hello, 世界!", kTestKey, kTestCert, {kTestCert2}, 0,
                0, 0, 0);
  TestRoundTrip(kUnicodePassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, 0, 0, 0, 0);

  // Test various fields being missing.
  TestRoundTrip(kPassword, nullptr /* no name */, {} /* no key */, kTestCert,
                {kTestCert2}, 0, 0, 0, 0);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {} /* no chain */, 0, 0, 0, 0);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, {} /* no leaf */,
                {} /* no chain */, 0, 0, 0, 0);

  // Test encryption parameters.
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_pbe_WithSHA1And40BitRC2_CBC,
                NID_pbe_WithSHA1And40BitRC2_CBC, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_pbe_WithSHA1And128BitRC4,
                NID_pbe_WithSHA1And128BitRC4, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_pbe_WithSHA1And3_Key_TripleDES_CBC,
                NID_pbe_WithSHA1And3_Key_TripleDES_CBC, 100, 100);

  // PBES2 ciphers.
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_rc2_cbc, NID_rc2_cbc, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_des_ede3_cbc, NID_des_ede3_cbc, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_aes_128_cbc, NID_aes_128_cbc, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_aes_192_cbc, NID_aes_192_cbc, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_aes_256_cbc, NID_aes_256_cbc, 100, 100);

  // Mix and match.
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_pbe_WithSHA1And40BitRC2_CBC,
                NID_pbe_WithSHA1And3_Key_TripleDES_CBC, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_pbe_WithSHA1And3_Key_TripleDES_CBC,
                NID_aes_256_cbc, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_aes_256_cbc,
                NID_pbe_WithSHA1And3_Key_TripleDES_CBC, 100, 100);
  TestRoundTrip(kPassword, nullptr /* no name */, kTestKey, kTestCert,
                {kTestCert2}, NID_aes_128_cbc, NID_aes_256_cbc, 100, 100);

  // Test unencrypted and partially unencrypted PKCS#12 files.
  TestRoundTrip(kPassword, /*name=*/nullptr, kTestKey, kTestCert, {kTestCert2},
                /*key_nid=*/-1,
                /*cert_nid=*/-1, /*iterations=*/100, /*mac_iterations=*/100);
  TestRoundTrip(kPassword, /*name=*/nullptr, kTestKey, kTestCert, {kTestCert2},
                /*key_nid=*/NID_pbe_WithSHA1And3_Key_TripleDES_CBC,
                /*cert_nid=*/-1, /*iterations=*/100, /*mac_iterations=*/100);
  TestRoundTrip(kPassword, /*name=*/nullptr, kTestKey, kTestCert, {kTestCert2},
                /*key_nid=*/-1,
                /*cert_nid=*/NID_pbe_WithSHA1And3_Key_TripleDES_CBC,
                /*iterations=*/100, /*mac_iterations=*/100);
}